

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O1

void __thiscall
Bipartition::Bipartition
          (Bipartition *this,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge)

{
  pointer puVar1;
  bool bVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this->_vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001409d0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition).m_num_bits = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48.m_bits,&edge->m_bits)
  ;
  local_48.m_num_bits = edge->m_num_bits;
  if (&local_48 != &this->partition) {
    puVar1 = (this->partition).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->partition).m_num_bits = local_48.m_num_bits;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("(b.m_bits = buffer_type()).empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x2a2,
                    "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    local_48.m_num_bits = 0;
  }
  bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_48);
  if (bVar2) {
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

Bipartition::Bipartition(const boost::dynamic_bitset<> &edge) {
    partition = boost::dynamic_bitset<>(edge);
}